

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

int __thiscall
FpgaIO::PromProgramPage(FpgaIO *this,uint32_t addr,uint8_t *bytes,uint nbytes,ProgressCallback cb)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  uint uVar7;
  quadlet_t read_data;
  uint32_t status;
  uint32_t nWritten;
  ostringstream msg;
  uint8_t page_data [260];
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  uint local_2c8;
  byte local_2c4 [4];
  ulong local_2c0;
  uint32_t local_2b4;
  ostringstream local_2b0;
  undefined7 uStack_2af;
  ios_base local_240 [264];
  uint local_138;
  undefined4 uStack_134;
  long local_130;
  long local_128 [31];
  
  if (nbytes < 0x101) {
    pBVar1 = (this->super_BoardIO).port;
    (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,8,0x6000000);
    local_138 = (addr & 0xff0000) >> 8 | 2 | (addr & 0xff00) << 8 | addr << 0x18;
    memcpy(&uStack_134,bytes,(ulong)nbytes);
    uVar3 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
    uVar6 = 0xc0;
    if (3 < uVar3) {
      uVar6 = 0x2000;
    }
    pBVar1 = (this->super_BoardIO).port;
    iVar4 = (*pBVar1->_vptr_BasePort[0x27])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar6,&local_138,
                       (ulong)(nbytes + 4));
    if ((char)iVar4 != '\0') {
      pBVar1 = (this->super_BoardIO).port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_2c8);
      if ((char)iVar4 == '\0') {
        return -1;
      }
      local_2c0 = (ulong)nbytes;
      do {
        if ((local_2c8 & 0xf) == 0) {
          if (0xffffff < local_2c8) {
            std::__cxx11::ostringstream::ostringstream(&local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: FPGA error = ",0x26);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_2b0);
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_2e8,local_2e0);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)((char *)local_2e8);
            }
            if (local_2e8 != local_2d8) {
              operator_delete(local_2e8,local_2d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream(&local_2b0);
            std::ios_base::~ios_base(local_240);
          }
          bVar2 = PromGetResult(this,&local_2b4,PROM_M25P16);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(&local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: could not get PROM result",
                       0x32);
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_2e8,local_2e0);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)((char *)local_2e8);
            }
            if (local_2e8 != local_2d8) {
              operator_delete(local_2e8,local_2d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream(&local_2b0);
            std::ios_base::~ios_base(local_240);
          }
          uVar7 = local_2b4 * 4 - 4;
          if (local_2b4 == 0) {
            uVar7 = 0;
          }
          if (uVar7 != nbytes) {
            std::__cxx11::ostringstream::ostringstream(&local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: wrote ",0x1f);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes",6);
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_2e8,local_2e0);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)((char *)local_2e8);
            }
            if (local_2e8 != local_2d8) {
              operator_delete(local_2e8,local_2d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream(&local_2b0);
            std::ios_base::~ios_base(local_240);
          }
          bVar2 = PromGetStatus(this,(uint32_t *)local_2c4,PROM_M25P16);
          if ((local_2c4[0] & 1) == 0) {
            return uVar7;
          }
          local_2c0 = CONCAT44(local_2c0._4_4_,uVar7);
          do {
            if (bVar2 == false) {
              std::__cxx11::ostringstream::ostringstream(&local_2b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: could not get PROM status",
                         0x32);
              std::ios::widen((char)*(undefined8 *)(CONCAT71(uStack_2af,local_2b0) + -0x18) +
                              (char)&local_2b0);
              std::ostream::put((char)&local_2b0);
              std::ostream::flush();
              if (cb == (ProgressCallback)0x0) {
                std::__cxx11::stringbuf::str();
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_2e8,local_2e0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                std::ostream::put((char)poVar5);
                std::ostream::flush();
              }
              else {
                std::__cxx11::stringbuf::str();
                (*cb)((char *)local_2e8);
              }
              if (local_2e8 != local_2d8) {
                operator_delete(local_2e8,local_2d8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(&local_2b0);
              std::ios_base::~ios_base(local_240);
            }
            else if (cb == (ProgressCallback)0x0) {
              local_2b0 = (ostringstream)0x2e;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)&local_2b0,1);
            }
            else {
              bVar2 = (*cb)((char *)0x0);
              if (!bVar2) {
                return 0;
              }
            }
            bVar2 = PromGetStatus(this,(uint32_t *)local_2c4,PROM_M25P16);
          } while ((local_2c4[0] & 1) != 0);
          return (int)local_2c0;
        }
        if (cb == (ProgressCallback)0x0) {
          local_2b0 = (ostringstream)0x2e;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_2b0,1);
        }
        else {
          bVar2 = (*cb)((char *)0x0);
          if (!bVar2) {
            return -1;
          }
        }
        pBVar1 = (this->super_BoardIO).port;
        iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_2c8);
      } while ((char)iVar4 != '\0');
      return -1;
    }
    std::__cxx11::ostringstream::ostringstream(&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: failed to write block, nbytes = ",
               0x39);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_2b0);
    if (cb == (ProgressCallback)0x0) {
      std::__cxx11::stringbuf::str();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_2e8,local_2e0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      std::__cxx11::stringbuf::str();
      (*cb)((char *)local_2e8);
    }
    if (local_2e8 == local_2d8) goto LAB_0010a810;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"FpgaIO::PromProgramPage: error, nbytes = ",0x29);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (max = ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    if (cb == (ProgressCallback)0x0) {
      std::__cxx11::stringbuf::str();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)CONCAT44(uStack_134,local_138),local_130);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      std::__cxx11::stringbuf::str();
      (*cb)((char *)CONCAT44(uStack_134,local_138));
    }
    local_2e8 = (long *)CONCAT44(uStack_134,local_138);
    local_2d8[0] = local_128[0];
    if (local_2e8 == local_128) goto LAB_0010a810;
  }
  operator_delete(local_2e8,local_2d8[0] + 1);
LAB_0010a810:
  std::__cxx11::ostringstream::~ostringstream(&local_2b0);
  std::ios_base::~ios_base(local_240);
  return -1;
}

Assistant:

int FpgaIO::PromProgramPage(uint32_t addr, const uint8_t *bytes,
                           unsigned int nbytes, const ProgressCallback cb)
{
    const unsigned int MAX_PAGE = 256;  // 64 quadlets
    if (nbytes > MAX_PAGE) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: error, nbytes = " << nbytes
            << " (max = " << MAX_PAGE << ")";
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    PromWriteEnable();
    // Block write of the data (+1 quad for command)
    uint8_t page_data[MAX_PAGE+sizeof(quadlet_t)];
    quadlet_t *data_ptr = reinterpret_cast<quadlet_t *>(page_data);
    // First quadlet is the "page program" instruction (0x02)
    data_ptr[0] = bswap_32(0x02000000 | (addr & 0x00ffffff));
    // Remaining quadlets are the data to be programmed. These do not
    // need to be byte-swapped.
    memcpy(page_data+sizeof(quadlet_t), bytes, nbytes);

    // select address based on firmware version number
    uint32_t fver = GetFirmwareVersion();
    nodeaddr_t address;
    if (fver >= 4) {address = 0x2000;}
    else {address = 0xc0;}
    if (!port->WriteBlock(BoardId, address, data_ptr, nbytes+sizeof(quadlet_t))) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: failed to write block, nbytes = " << nbytes;
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    // Read FPGA status register; if 4 LSB are 0, command has finished
    quadlet_t read_data;
    if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    while (read_data&0x000f) {
        PROGRESS_CALLBACK(cb, -1);
        if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    }
    if (read_data & 0xff000000) { // shouldn't happen
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: FPGA error = " << read_data;
        ERROR_CALLBACK(cb, msg);
    }
    // Now, read result. This should be the number of quadlets written.
    uint32_t nWritten;
    if (!PromGetResult(nWritten)) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: could not get PROM result";
        ERROR_CALLBACK(cb, msg);
    }
    if (nWritten > 0)
        nWritten = 4*(nWritten-1);  // convert from quadlets to bytes
    if (nWritten != nbytes) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: wrote " << nWritten << " of "
            << nbytes << " bytes";
        ERROR_CALLBACK(cb, msg);
    }
    // Wait for "Write in Progress" bit to be cleared
    uint32_t status;
    bool ret = PromGetStatus(status);
    while (status&MASK_WIP) {
        if (ret) {
            PROGRESS_CALLBACK(cb, 0);
        }
        else {
            std::ostringstream msg;
            msg << "FpgaIO::PromProgramPage: could not get PROM status" << std::endl;
            ERROR_CALLBACK(cb, msg);
        }
        ret = PromGetStatus(status);
    }
    return nWritten;
}